

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O1

ArrayNewFixed * __thiscall
wasm::Builder::makeArrayNewFixed<std::initializer_list<wasm::Expression*>>
          (Builder *this,HeapType type,initializer_list<wasm::Expression_*> *values)

{
  ArrayNewFixed *pAVar1;
  MixedArena *this_00;
  
  this_00 = &this->wasm->allocator;
  pAVar1 = (ArrayNewFixed *)MixedArena::allocSpace(this_00,0x30,8);
  (pAVar1->super_SpecificExpression<(wasm::Expression::Id)73>).super_Expression._id =
       ArrayNewFixedId;
  (pAVar1->super_SpecificExpression<(wasm::Expression::Id)73>).super_Expression.type.id = 0;
  (pAVar1->values).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data =
       (Expression **)0x0;
  (pAVar1->values).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
  usedElements = 0;
  (pAVar1->values).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
  allocatedElements = 0;
  (pAVar1->values).allocator = this_00;
  ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*>::
  set<std::initializer_list<wasm::Expression*>>
            ((ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*> *)&pAVar1->values,
             values);
  if (((uint)(0x7c < type.id) * 4 + 3 & (uint)type.id) == 0) {
    (pAVar1->super_SpecificExpression<(wasm::Expression::Id)73>).super_Expression.type.id = type.id;
    ::wasm::ArrayNewFixed::finalize();
    return pAVar1;
  }
  __assert_fail("!(heapType.getID() & (TupleMask | NullMask | (heapType.isBasic() ? 0 : ExactMask)))"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                ,0x14c,"wasm::Type::Type(HeapType, Nullability, Exactness)");
}

Assistant:

ArrayNewFixed* makeArrayNewFixed(HeapType type, const T& values) {
    auto* ret = wasm.allocator.alloc<ArrayNewFixed>();
    ret->values.set(values);
    ret->type = Type(type, NonNullable);
    ret->finalize();
    return ret;
  }